

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3Fts5ConfigParseRank(char *zIn,char **pzRank,char **pzRankArgs)

{
  char *pcVar1;
  char *pArgs;
  void *pvStack_40;
  int rc;
  char *zRankArgs;
  char *zRank;
  char *pRank;
  char *p;
  char **pzRankArgs_local;
  char **pzRank_local;
  char *zIn_local;
  
  zRankArgs = (char *)0x0;
  pvStack_40 = (void *)0x0;
  pArgs._4_4_ = 0;
  *pzRank = (char *)0x0;
  *pzRankArgs = (char *)0x0;
  p = (char *)pzRankArgs;
  pzRankArgs_local = pzRank;
  pzRank_local = (char **)zIn;
  if (zIn == (char *)0x0) {
    pArgs._4_4_ = 1;
    pRank = (char *)0x0;
  }
  else {
    pRank = zIn;
    zRank = fts5ConfigSkipWhitespace(zIn);
    pRank = zRank;
    pRank = fts5ConfigSkipBareword(zRank);
    if (pRank == (char *)0x0) {
      pArgs._4_4_ = 1;
    }
    else {
      zRankArgs = (char *)sqlite3Fts5MallocZero
                                    ((int *)((long)&pArgs + 4),
                                     (sqlite3_int64)(pRank + (1 - (long)zRank)));
      if (zRankArgs != (char *)0x0) {
        memcpy(zRankArgs,zRank,(long)pRank - (long)zRank);
      }
    }
    if (pArgs._4_4_ == 0) {
      pcVar1 = fts5ConfigSkipWhitespace(pRank);
      if (*pcVar1 != '(') {
        pArgs._4_4_ = 1;
      }
      pRank = pcVar1 + 1;
    }
    if ((pArgs._4_4_ == 0) &&
       (pcVar1 = fts5ConfigSkipWhitespace(pRank), pRank = pcVar1, *pcVar1 != ')')) {
      pRank = fts5ConfigSkipArgs(pcVar1);
      if (pRank == (char *)0x0) {
        pArgs._4_4_ = 1;
      }
      else {
        pvStack_40 = sqlite3Fts5MallocZero
                               ((int *)((long)&pArgs + 4),
                                (sqlite3_int64)(pRank + (1 - (long)pcVar1)));
        if (pvStack_40 != (void *)0x0) {
          memcpy(pvStack_40,pcVar1,(long)pRank - (long)pcVar1);
        }
      }
    }
  }
  if (pArgs._4_4_ == 0) {
    *pzRankArgs_local = zRankArgs;
    *(void **)p = pvStack_40;
  }
  else {
    sqlite3_free(zRankArgs);
  }
  return pArgs._4_4_;
}

Assistant:

static int sqlite3Fts5ConfigParseRank(
  const char *zIn,                /* Input string */
  char **pzRank,                  /* OUT: Rank function name */
  char **pzRankArgs               /* OUT: Rank function arguments */
){
  const char *p = zIn;
  const char *pRank;
  char *zRank = 0;
  char *zRankArgs = 0;
  int rc = SQLITE_OK;

  *pzRank = 0;
  *pzRankArgs = 0;

  if( p==0 ){
    rc = SQLITE_ERROR;
  }else{
    p = fts5ConfigSkipWhitespace(p);
    pRank = p;
    p = fts5ConfigSkipBareword(p);

    if( p ){
      zRank = sqlite3Fts5MallocZero(&rc, 1 + p - pRank);
      if( zRank ) memcpy(zRank, pRank, p-pRank);
    }else{
      rc = SQLITE_ERROR;
    }

    if( rc==SQLITE_OK ){
      p = fts5ConfigSkipWhitespace(p);
      if( *p!='(' ) rc = SQLITE_ERROR;
      p++;
    }
    if( rc==SQLITE_OK ){
      const char *pArgs; 
      p = fts5ConfigSkipWhitespace(p);
      pArgs = p;
      if( *p!=')' ){
        p = fts5ConfigSkipArgs(p);
        if( p==0 ){
          rc = SQLITE_ERROR;
        }else{
          zRankArgs = sqlite3Fts5MallocZero(&rc, 1 + p - pArgs);
          if( zRankArgs ) memcpy(zRankArgs, pArgs, p-pArgs);
        }
      }
    }
  }

  if( rc!=SQLITE_OK ){
    sqlite3_free(zRank);
    assert( zRankArgs==0 );
  }else{
    *pzRank = zRank;
    *pzRankArgs = zRankArgs;
  }
  return rc;
}